

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

bool __thiscall MetaCommand::GetValueAsBool(MetaCommand *this,Option *option,string *fieldName)

{
  __type _Var1;
  bool bVar2;
  bool bVar3;
  pointer __lhs;
  string *__lhs_00;
  string fieldname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)fieldName);
  if (fieldName->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_40);
  }
  __lhs = (option->fields).
          super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
          super__Vector_impl_data._M_start;
  do {
    if (__lhs == (option->fields).
                 super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl
                 .super__Vector_impl_data._M_finish) {
      bVar3 = false;
LAB_00116547:
      std::__cxx11::string::~string((string *)&local_40);
      return bVar3;
    }
    _Var1 = std::operator==(&__lhs->name,&local_40);
    if (_Var1) {
      __lhs_00 = &__lhs->value;
      bVar2 = std::operator==(__lhs_00,"true");
      bVar3 = true;
      if (!bVar2) {
        bVar2 = std::operator==(__lhs_00,"1");
        if (!bVar2) {
          bVar2 = std::operator==(__lhs_00,"True");
          if (!bVar2) {
            bVar3 = std::operator==(__lhs_00,"TRUE");
          }
        }
      }
      goto LAB_00116547;
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

bool MetaCommand::GetValueAsBool(Option option,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = option.name;
  }

  METAIO_STL::vector<Field>::const_iterator itField = option.fields.begin();
  while(itField != option.fields.end())
    {
    if((*itField).name == fieldname)
      {
      if((*itField).value == "true"
         || (*itField).value == "1"
         || (*itField).value == "True"
         || (*itField).value == "TRUE"
        )
        {
        return true;
        }
      return false;
      }
    ++itField;
    }
  return false;
}